

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRational.cpp
# Opt level: O0

void __thiscall Imf_2_5::Rational::Rational(Rational *this,double x)

{
  int *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double unaff_retaddr;
  double in_stack_00000008;
  double e;
  int sign;
  int local_14;
  double local_10;
  
  if (in_XMM0_Qa < 0.0) {
    if (0.0 <= in_XMM0_Qa) {
      *in_RDI = 0;
      in_RDI[1] = 0;
      return;
    }
    local_14 = -1;
    local_10 = -in_XMM0_Qa;
  }
  else {
    local_14 = 1;
    local_10 = in_XMM0_Qa;
  }
  if (local_10 < 2147483647.5) {
    dVar1 = anon_unknown_1::denom(in_stack_00000008,unaff_retaddr);
    in_RDI[1] = (int)(long)dVar1;
    dVar1 = floor(local_10 * (double)(uint)in_RDI[1] + 0.5);
    *in_RDI = local_14 * (int)dVar1;
  }
  else {
    *in_RDI = local_14;
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

Rational::Rational (double x)
{
    int sign;

    if (x >= 0)
    {
	sign = 1;	// positive
    }
    else if (x < 0)
    {
	sign = -1;	// negative
	x = -x;
    }
    else
    {
	n = 0;		// NaN
	d = 0;
	return;
    }

    if (x >= (1U << 31) - 0.5)
    {
	n = sign;	// infinity
	d = 0;
	return;
    }

    double e = (x < 1? 1: x) / (1U << 30);
    d = (unsigned int) denom (x, e);
    n = sign * (int) floor (x * d + 0.5);
}